

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BindTypeOfFunctionExpression(duckdb *this,FunctionBindExpressionInput *input)

{
  reference this_00;
  pointer pEVar1;
  BoundConstantExpression *pBVar2;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  Value local_98 [64];
  Value local_58 [64];
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](*(vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           **)(input + 0x10),0);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  if ((byte)((char)pEVar1[0x38] - 1U) < 2) {
    *(undefined8 *)this = 0;
  }
  else {
    duckdb::LogicalType::ToString_abi_cxx11_();
    duckdb::Value::Value(local_98,local_b8);
    pBVar2 = (BoundConstantExpression *)operator_new(0x98);
    duckdb::Value::Value(local_58,local_98);
    duckdb::BoundConstantExpression::BoundConstantExpression(pBVar2,local_58);
    duckdb::Value::~Value(local_58);
    *(BoundConstantExpression **)this = pBVar2;
    duckdb::Value::~Value(local_98);
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0]);
    }
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BindTypeOfFunctionExpression(FunctionBindExpressionInput &input) {
	auto &return_type = input.children[0]->return_type;
	if (return_type.id() == LogicalTypeId::UNKNOWN || return_type.id() == LogicalTypeId::SQLNULL) {
		// parameter - unknown return type
		return nullptr;
	}
	// emit a constant expression
	return make_uniq<BoundConstantExpression>(Value(return_type.ToString()));
}